

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_wal_checkpoint_v2(sqlite3 *db,char *zDb,int eMode,int *pnLog,int *pnCkpt)

{
  int iDb;
  uint uVar1;
  
  if (pnLog != (int *)0x0) {
    *pnLog = -1;
  }
  if (pnCkpt != (int *)0x0) {
    *pnCkpt = -1;
  }
  uVar1 = 0x15;
  if ((uint)eMode < 4) {
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    iDb = 10;
    if ((zDb != (char *)0x0) && (*zDb != '\0')) {
      iDb = sqlite3FindDbName(db,zDb);
    }
    if (iDb < 0) {
      uVar1 = 1;
      sqlite3ErrorWithMsg(db,1,"unknown database: %s",zDb);
    }
    else {
      (db->busyHandler).nBusy = 0;
      uVar1 = sqlite3Checkpoint(db,iDb,eMode,pnLog,pnCkpt);
      db->errCode = uVar1;
      if ((uVar1 != 0) || (db->pErr != (sqlite3_value *)0x0)) {
        sqlite3ErrorFinish(db,uVar1);
      }
    }
    if ((uVar1 == 0xc0a) || (db->mallocFailed != '\0')) {
      apiOomError(db);
      uVar1 = 7;
    }
    else {
      uVar1 = uVar1 & db->errMask;
    }
    if (db->nVdbeActive == 0) {
      (db->u1).isInterrupted = 0;
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return uVar1;
}

Assistant:

SQLITE_API int sqlite3_wal_checkpoint_v2(
  sqlite3 *db,                    /* Database handle */
  const char *zDb,                /* Name of attached database (or NULL) */
  int eMode,                      /* SQLITE_CHECKPOINT_* value */
  int *pnLog,                     /* OUT: Size of WAL log in frames */
  int *pnCkpt                     /* OUT: Total number of frames checkpointed */
){
#ifdef SQLITE_OMIT_WAL
  return SQLITE_OK;
#else
  int rc;                         /* Return code */
  int iDb = SQLITE_MAX_ATTACHED;  /* sqlite3.aDb[] index of db to checkpoint */

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif

  /* Initialize the output variables to -1 in case an error occurs. */
  if( pnLog ) *pnLog = -1;
  if( pnCkpt ) *pnCkpt = -1;

  assert( SQLITE_CHECKPOINT_PASSIVE==0 );
  assert( SQLITE_CHECKPOINT_FULL==1 );
  assert( SQLITE_CHECKPOINT_RESTART==2 );
  assert( SQLITE_CHECKPOINT_TRUNCATE==3 );
  if( eMode<SQLITE_CHECKPOINT_PASSIVE || eMode>SQLITE_CHECKPOINT_TRUNCATE ){
    /* EVIDENCE-OF: R-03996-12088 The M parameter must be a valid checkpoint
    ** mode: */
    return SQLITE_MISUSE;
  }

  sqlite3_mutex_enter(db->mutex);
  if( zDb && zDb[0] ){
    iDb = sqlite3FindDbName(db, zDb);
  }
  if( iDb<0 ){
    rc = SQLITE_ERROR;
    sqlite3ErrorWithMsg(db, SQLITE_ERROR, "unknown database: %s", zDb);
  }else{
    db->busyHandler.nBusy = 0;
    rc = sqlite3Checkpoint(db, iDb, eMode, pnLog, pnCkpt);
    sqlite3Error(db, rc);
  }
  rc = sqlite3ApiExit(db, rc);

  /* If there are no active statements, clear the interrupt flag at this
  ** point.  */
  if( db->nVdbeActive==0 ){
    db->u1.isInterrupted = 0;
  }

  sqlite3_mutex_leave(db->mutex);
  return rc;
#endif
}